

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

uint32 google::protobuf::ghtonl(uint32 x)

{
  undefined4 local_10;
  uint32 result;
  uint32 x_local;
  
  local_10 = CONCAT13((char)x,CONCAT12((char)(x >> 8),CONCAT11((char)(x >> 0x10),(char)(x >> 0x18)))
                     );
  return local_10;
}

Assistant:

uint32 ghtonl(uint32 x) {
  union {
    uint32 result;
    uint8 result_array[4];
  };
  result_array[0] = static_cast<uint8>(x >> 24);
  result_array[1] = static_cast<uint8>((x >> 16) & 0xFF);
  result_array[2] = static_cast<uint8>((x >> 8) & 0xFF);
  result_array[3] = static_cast<uint8>(x & 0xFF);
  return result;
}